

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall Js::JSONStringifier::ReadSpace(JSONStringifier *this,Var space)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  BOOL BVar5;
  RecyclableObject *this_00;
  undefined4 *puVar6;
  JavascriptString *spaceString;
  charcount_t cVar7;
  double dVar8;
  
  if (space == (Var)0x0) {
    return;
  }
  bVar3 = TaggedInt::Is(space);
  if (bVar3) {
LAB_00a3b652:
    cVar4 = TaggedInt::ToInt32(space);
    cVar7 = 10;
    if ((int)cVar4 < 10) {
      cVar7 = cVar4;
    }
    cVar4 = 0;
    if (0 < (int)cVar7) {
      cVar4 = cVar7;
    }
  }
  else {
    if ((ulong)space >> 0x32 == 0) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(space);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00a3b7d4;
        *puVar6 = 0;
      }
      TVar1 = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00a3b7d4:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      if (2 < TVar1 - TypeIds_Number) {
        if (TVar1 == TypeIds_StringObject) {
          spaceString = JavascriptConversion::ToString(space,this->scriptContext);
LAB_00a3b7c1:
          SetStringGap(this,spaceString);
          return;
        }
        if (TVar1 == TypeIds_String) {
          spaceString = UnsafeVarTo<Js::JavascriptString>(space);
          goto LAB_00a3b7c1;
        }
        if (TVar1 != TypeIds_NumberObject) {
          if (TVar1 != TypeIds_FirstNumberType) {
            return;
          }
          goto LAB_00a3b652;
        }
      }
    }
    dVar8 = JavascriptConversion::ToInteger(space,this->scriptContext);
    if (dVar8 <= 0.0) {
      return;
    }
    if (10.0 <= dVar8) {
      dVar8 = 10.0;
    }
    cVar4 = (charcount_t)(long)dVar8;
  }
  SetNumericGap(this,cVar4);
  return;
}

Assistant:

void
JSONStringifier::ReadSpace(_In_opt_ Var space)
{
    if (space != nullptr)
    {
        switch (JavascriptOperators::GetTypeId(space))
        {
        case TypeIds_Integer:
            this->SetNumericGap(static_cast<charcount_t>(max(0, min(static_cast<int>(MaxGapLength), TaggedInt::ToInt32(space)))));

            break;
        case TypeIds_Number:
        case TypeIds_NumberObject:
        case TypeIds_Int64Number:
        case TypeIds_UInt64Number:
        {
            double numericSpace = JavascriptConversion::ToInteger(space, this->scriptContext);
            if (numericSpace > 0)
            {
                SetNumericGap(numericSpace < static_cast<double>(MaxGapLength) ? static_cast<charcount_t>(numericSpace) : MaxGapLength);
            }
            break;
        }
        case TypeIds_String:
            this->SetStringGap(UnsafeVarTo<JavascriptString>(space));
            break;
        case TypeIds_StringObject:
            this->SetStringGap(JavascriptConversion::ToString(space, this->scriptContext));
            break;
        default:
            break;
        }
    }
}